

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_15::JUnitReporter::test_case_end
          (JUnitReporter *this,CurrentTestCaseStats *param_1)

{
  long lVar1;
  vector<doctest::String,_std::allocator<doctest::String>_> *__x;
  undefined1 auVar2 [16];
  double dVar3;
  timeval t;
  _Vector_impl_data in_stack_ffffffffffffffb8;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  lVar1 = (local_28.tv_sec * 1000000 + local_28.tv_usec) - (this->timer).m_ticks;
  auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar2._0_8_ = lVar1;
  auVar2._12_4_ = 0x45300000;
  dVar3 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000000.0;
  dVar3 = (double)(~-(ulong)(dVar3 < 0.0001) & (ulong)dVar3);
  (this->testCaseData).testcases.
  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].time = dVar3;
  (this->testCaseData).totalSeconds = (this->testCaseData).totalSeconds + dVar3;
  __x = &this->deepestSubcaseStackNames;
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)&stack0xffffffffffffffc0,
             __x);
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase
            (&this->testCaseData,
             (vector<doctest::String,_std::allocator<doctest::String>_>)in_stack_ffffffffffffffb8);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)&stack0xffffffffffffffc0);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
            (__x,(__x->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
                 _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats&) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();
        }